

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartOutputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::MultiPartOutputFile::Data::writeHeadersToFile
          (Data *this,vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *headers)

{
  __type _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  reference ppOVar3;
  size_type sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long in_RDI;
  size_t i;
  undefined1 in_stack_00000217;
  OStream *in_stack_00000218;
  Header *in_stack_00000220;
  char *in_stack_ffffffffffffffc8;
  OStream *in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  
  pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  while( true ) {
    __rhs = pbVar5;
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::size
                       ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)in_RSI);
    if (pbVar2 <= pbVar5) break;
    std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
              ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)in_RSI,(size_type)__rhs)
    ;
    Header::type_abi_cxx11_((Header *)0x20e62d);
    _Var1 = std::operator==(in_RSI,__rhs);
    if (_Var1) {
      std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
                ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)in_RSI,
                 (size_type)__rhs);
      in_stack_ffffffffffffffd0 =
           (OStream *)Header::writeTo(in_stack_00000220,in_stack_00000218,(bool)in_stack_00000217);
      ppOVar3 = std::vector<Imf_3_4::OutputPartData_*,_std::allocator<Imf_3_4::OutputPartData_*>_>::
                operator[]((vector<Imf_3_4::OutputPartData_*,_std::allocator<Imf_3_4::OutputPartData_*>_>
                            *)(in_RDI + 0x38),(size_type)__rhs);
      (*ppOVar3)->previewPosition = (uint64_t)in_stack_ffffffffffffffd0;
    }
    else {
      std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
                ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)in_RSI,
                 (size_type)__rhs);
      in_stack_ffffffffffffffc8 =
           (char *)Header::writeTo(in_stack_00000220,in_stack_00000218,(bool)in_stack_00000217);
      ppOVar3 = std::vector<Imf_3_4::OutputPartData_*,_std::allocator<Imf_3_4::OutputPartData_*>_>::
                operator[]((vector<Imf_3_4::OutputPartData_*,_std::allocator<Imf_3_4::OutputPartData_*>_>
                            *)(in_RDI + 0x38),(size_type)__rhs);
      (*ppOVar3)->previewPosition = (uint64_t)in_stack_ffffffffffffffc8;
    }
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__rhs->field_0x1;
  }
  sVar4 = std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::size
                    ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)in_RSI);
  if (sVar4 != 1) {
    Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void
MultiPartOutputFile::Data::writeHeadersToFile (const vector<Header>& headers)
{
    for (size_t i = 0; i < headers.size (); i++)
    {

        // (TODO) consider deep files' preview images here.
        if (headers[i].type () == TILEDIMAGE)
            parts[i]->previewPosition = headers[i].writeTo (*os, true);
        else
            parts[i]->previewPosition = headers[i].writeTo (*os, false);
    }

    //
    // If a multipart file, write zero-length attribute name to mark the end of all headers.
    //

    if (headers.size () != 1)
        OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write<
            OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (*os, "");
}